

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

uchar * cppcms::b64url::decode(uchar *begin,uchar *end,uchar *target)

{
  size_t sVar1;
  
  for (sVar1 = (long)end - (long)begin; 3 < (long)sVar1; sVar1 = sVar1 - 4) {
    anon_unknown.dwarf_12914c::bdecode(begin,target,4);
    begin = begin + 4;
    target = target + 3;
  }
  if (begin != end) {
    sVar1 = anon_unknown.dwarf_12914c::bdecode(begin,target,sVar1);
    target = target + sVar1;
  }
  return target;
}

Assistant:

unsigned char *decode(unsigned char const *begin,unsigned char const *end,unsigned char *target)
{
	while(end - begin >=4) {
		bdecode(begin,target,4);
		begin+=4;
		target+=3;
	}
	if(end!=begin)
		target+=bdecode(begin,target,end-begin);
	return target;
}